

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyph.cc
# Opt level: O1

bool woff2::ReadCompositeGlyphData(Buffer *buffer,Glyph *glyph)

{
  ulong uVar1;
  long lVar2;
  ushort uVar3;
  uint8_t *puVar4;
  size_t sVar5;
  ushort uVar6;
  bool bVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  
  glyph->have_instructions = false;
  puVar4 = buffer->buffer_;
  sVar5 = buffer->offset_;
  glyph->composite_data = puVar4 + sVar5;
  uVar8 = buffer->length_;
  sVar9 = sVar5;
  do {
    uVar1 = sVar9 + 2;
    if (uVar8 < uVar1) goto LAB_00107c75;
    uVar3 = *(ushort *)(puVar4 + sVar9);
    uVar6 = uVar3 >> 8;
    buffer->offset_ = uVar1;
    glyph->have_instructions = (bool)(glyph->have_instructions | (byte)uVar3 & 1);
    lVar2 = (ulong)(uVar6 & 1) * 2;
    if ((uVar6 & 8) == 0) {
      if ((uVar6 & 0x40) == 0) {
        uVar10 = lVar2 + 4U | (ulong)(uVar3 >> 0xc & 8);
      }
      else {
        uVar10 = lVar2 + 8;
      }
    }
    else {
      uVar10 = lVar2 + 6;
    }
    if (uVar8 - uVar10 < uVar1) {
      return false;
    }
    sVar9 = uVar1 + uVar10;
    if (uVar8 < sVar9) {
      return false;
    }
    buffer->offset_ = sVar9;
  } while ((uVar6 & 0x20) != 0);
  uVar8 = buffer->offset_ - sVar5;
  if (uVar8 >> 0x20 == 0) {
    glyph->composite_data_size = (uint32_t)uVar8;
    bVar7 = true;
  }
  else {
LAB_00107c75:
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ReadCompositeGlyphData(Buffer* buffer, Glyph* glyph) {
  glyph->have_instructions = false;
  glyph->composite_data = buffer->buffer() + buffer->offset();
  size_t start_offset = buffer->offset();
  uint16_t flags = kFLAG_MORE_COMPONENTS;
  while (flags & kFLAG_MORE_COMPONENTS) {
    if (!buffer->ReadU16(&flags)) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyph->have_instructions |= (flags & kFLAG_WE_HAVE_INSTRUCTIONS) != 0;
    size_t arg_size = 2;  // glyph index
    if (flags & kFLAG_ARG_1_AND_2_ARE_WORDS) {
      arg_size += 4;
    } else {
      arg_size += 2;
    }
    if (flags & kFLAG_WE_HAVE_A_SCALE) {
      arg_size += 2;
    } else if (flags & kFLAG_WE_HAVE_AN_X_AND_Y_SCALE) {
      arg_size += 4;
    } else if (flags & kFLAG_WE_HAVE_A_TWO_BY_TWO) {
      arg_size += 8;
    }
    if (!buffer->Skip(arg_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
  }
  if (buffer->offset() - start_offset > std::numeric_limits<uint32_t>::max()) {
    return FONT_COMPRESSION_FAILURE();
  }
  glyph->composite_data_size = buffer->offset() - start_offset;
  return true;
}